

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManPrintStats(Of_Man_t *p,char *pTitle)

{
  abctime aVar1;
  float fVar2;
  char *pTitle_local;
  Of_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ",pTitle);
    fVar2 = Of_Int2Flt((int)p->pPars->Delay);
    printf("Delay =%8.2f ",(double)fVar2);
    printf("Area =%8d  ",p->pPars->Area & 0xffffffff);
    printf("Edge =%9d  ",p->pPars->Edge & 0xffffffff);
    aVar1 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar1 - p->clkStart);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Of_ManPrintStats( Of_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Delay =%8.2f ", Of_Int2Flt((int)p->pPars->Delay) );
    printf( "Area =%8d  ",   (int)p->pPars->Area );
    printf( "Edge =%9d  ",   (int)p->pPars->Edge );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}